

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O3

void __thiscall
DenseHashMapMoveTest_InsertRValue_ValueMoveCount_Test::TestBody
          (DenseHashMapMoveTest_InsertRValue_ValueMoveCount_Test *this)

{
  pointer ppVar1;
  pair<const_int,_A> pVar2;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h;
  pair<int,_A> local_a0;
  AssertHelper local_98;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_8a;
  equal_to<int> local_89;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  local_88;
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  local_68;
  
  google::
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hashtable(&local_68,10,(hash<int> *)&local_98,&local_89,(SelectKey *)&local_88,
                    (SetKey *)&local_a0,&local_8a);
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_68.key_info.empty_key = 0;
  local_68.table = (pointer)malloc(local_68.num_buckets * 8);
  if (local_68.num_buckets != 0) {
    memset(local_68.table,0,local_68.num_buckets * 8);
  }
  A::copy_ctor = 0;
  A::copy_assign = 0;
  A::move_assign = 0;
  local_a0.first = 5;
  local_a0.second._i = 0;
  A::move_ctor = 1;
  google::
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::resize_delta(&local_68,1);
  local_98.data_._0_4_ = local_a0.first;
  google::
  dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
  ::insert_noresize<int,std::pair<int,A>>
            (&local_88,
             (dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
              *)&local_68,(int *)&local_98,&local_a0);
  local_a0 = (pair<int,_A>)((ulong)local_a0 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_88,"0","A::copy_ctor",&local_a0.first,&A::copy_ctor);
  ppVar1 = local_88.first.pos;
  if ((char)local_88.first.ht == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if (local_88.first.pos == (pointer)0x0) {
      pVar2 = (pair<const_int,_A>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar2 = *local_88.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0xec,(char *)pVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
  }
  else {
    if (local_88.first.pos != (pointer)0x0) {
      if (*local_88.first.pos != (pair<const_int,_A>)(local_88.first.pos + 2)) {
        operator_delete((void *)*local_88.first.pos);
      }
      operator_delete(ppVar1);
    }
    local_a0 = (pair<int,_A>)((ulong)local_a0 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_88,"0","A::copy_assign",&local_a0.first,&A::copy_assign);
    ppVar1 = local_88.first.pos;
    if ((char)local_88.first.ht == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if (local_88.first.pos == (pointer)0x0) {
        pVar2 = (pair<const_int,_A>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      }
      else {
        pVar2 = *local_88.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0xed,(char *)pVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    }
    else {
      if (local_88.first.pos != (pointer)0x0) {
        if (*local_88.first.pos != (pair<const_int,_A>)(local_88.first.pos + 2)) {
          operator_delete((void *)*local_88.first.pos);
        }
        operator_delete(ppVar1);
      }
      local_a0.first = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_88,"2","A::move_ctor",&local_a0.first,&A::move_ctor);
      ppVar1 = local_88.first.pos;
      if ((char)local_88.first.ht == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if (local_88.first.pos == (pointer)0x0) {
          pVar2 = (pair<const_int,_A>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        }
        else {
          pVar2 = *local_88.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0xee,(char *)pVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      }
      else {
        if (local_88.first.pos != (pointer)0x0) {
          if (*local_88.first.pos != (pair<const_int,_A>)(local_88.first.pos + 2)) {
            operator_delete((void *)*local_88.first.pos);
          }
          operator_delete(ppVar1);
        }
        local_a0 = (pair<int,_A>)((ulong)local_a0 & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_88,"0","A::move_assign",&local_a0.first,&A::move_assign);
        if ((char)local_88.first.ht != '\0') goto LAB_00a43bc8;
        testing::Message::Message((Message *)&local_a0);
        if (local_88.first.pos == (pointer)0x0) {
          pVar2 = (pair<const_int,_A>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        }
        else {
          pVar2 = *local_88.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0xef,(char *)pVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_a0 != (pair<int,_A>)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
LAB_00a43bc8:
  if (local_88.first.pos != (pointer)0x0) {
    if (*local_88.first.pos != (pair<const_int,_A>)(local_88.first.pos + 2)) {
      operator_delete((void *)*local_88.first.pos);
    }
    operator_delete(local_88.first.pos);
  }
  if (local_68.table != (pointer)0x0) {
    free(local_68.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, InsertRValue_ValueMoveCount)
{
    dense_hash_map<int, A> h(10);
    h.set_empty_key(0);

    A::reset();
    h.insert(std::make_pair(5, A()));

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(2, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}